

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O1

void read_chunk(file *file)

{
  uint uVar1;
  bool bVar2;
  png_uint_32 pVar3;
  uint uVar4;
  int iVar5;
  uint next_type;
  png_uint_32 pVar6;
  ulong uVar7;
  uint i_2;
  uint uVar8;
  uint uVar9;
  uint i;
  int iVar10;
  png_uint_32 pVar11;
  byte local_48 [8];
  file *local_40;
  png_uint_32 local_34;
  
  pVar11 = file->type;
  if (pVar11 == 0) {
    stop(file,7,"read beyond IEND");
  }
  pVar6 = file->length;
  if (0x40 < (*(ushort *)file->global & 0xe0)) {
    read_chunk_cold_1();
  }
  pVar3 = crc_init_4(pVar11);
  file->crc = pVar3;
  if (pVar6 != 0) {
    do {
      uVar4 = read_byte(file);
      if (uVar4 == 0xffffffff) goto LAB_001052f9;
      pVar3 = pVar3 >> 8 ^ crc_table[(uVar4 ^ pVar3) & 0xff];
      pVar6 = pVar6 - 1;
    } while (pVar6 != 0);
    file->crc = pVar3;
  }
  iVar10 = 0;
  pVar6 = 0;
  do {
    iVar5 = read_byte(file);
    if (iVar5 == -1) goto LAB_00105214;
    pVar6 = pVar6 * 0x100 + iVar5;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 4);
  iVar10 = 4;
LAB_00105214:
  if (iVar10 == 4) {
    if (pVar11 == 0x49454e44) {
      pVar3 = 0;
      pVar11 = 0;
LAB_0010522f:
      process_chunk(file,pVar6,pVar3,pVar11);
      return;
    }
    iVar10 = 0;
    pVar3 = 0;
    do {
      iVar5 = read_byte(file);
      if (iVar5 == -1) goto LAB_00105270;
      pVar3 = pVar3 * 0x100 + iVar5;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 4);
    iVar10 = 4;
LAB_00105270:
    if (-1 < (int)pVar3 && iVar10 == 4) {
      iVar10 = 0;
      pVar11 = 0;
      do {
        iVar5 = read_byte(file);
        if (iVar5 == -1) goto LAB_001052c0;
        pVar11 = pVar11 * 0x100 + iVar5;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 4);
      iVar10 = 4;
LAB_001052c0:
      if ((iVar10 == 4) &&
         (((0x5a5a5a5a - (pVar11 & 0xdfdfffdf) |
           (pVar11 & 0xdfdfffdf) + 0xbebebebf | pVar11 & 0xc0c0e0c0 ^ 0x40404040) & 0xe0e0e0e0) == 0
         )) {
        file->read_count = file->read_count - 8;
        goto LAB_0010522f;
      }
    }
  }
LAB_001052f9:
  *(byte *)&file->status_code = (byte)file->status_code | 4;
  if ((undefined1  [96])((undefined1  [96])*file->global & (undefined1  [96])0xe0) !=
      (undefined1  [96])0x0) {
    read_chunk_cold_2();
  }
  file_setpos(file,&file->data_pos);
  file->read_count = 8;
  iVar10 = 0;
  uVar4 = 0;
  local_40 = file;
  do {
    iVar5 = read_byte(file);
    if (iVar5 == -1) goto LAB_0010535c;
    uVar4 = uVar4 * 0x100 + iVar5;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 4);
  iVar10 = 4;
LAB_0010535c:
  if (iVar10 == 4) {
    local_34 = file->type;
    pVar11 = crc_init_4(local_34);
    pVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if ((pVar11 ^ uVar4) == 0xffffffff) {
        if (local_34 == 0x49454e44) {
          local_40->length = pVar6;
          bVar2 = false;
          process_chunk(local_40,uVar4,0,0);
          iVar10 = 1;
        }
        else {
          uVar1 = (uint)uVar7;
          uVar9 = uVar8;
          if (uVar8 < uVar1 + 8) {
            do {
              iVar10 = read_byte(local_40);
              if (iVar10 == -1) goto LAB_00105426;
              uVar9 = uVar8 + 1;
              local_48[uVar8 & 7] = (byte)iVar10;
              uVar8 = uVar9;
            } while (uVar1 + 8 != uVar9);
          }
          uVar8 = uVar9 - (uVar1 & 0xfffffff8);
          uVar7 = (ulong)(uVar1 & 7);
          uVar9 = (uint)local_48[uVar1 + 3 & 7] |
                  (uint)local_48[uVar1 + 2 & 7] << 8 |
                  (uint)local_48[uVar1 + 1 & 7] << 0x10 | (uint)local_48[uVar7] << 0x18;
          if ((0x7ffffffe < uVar9) ||
             (next_type = (uint)local_48[uVar1 - 1 & 7] |
                          (uint)local_48[uVar1 + 6 & 7] << 8 |
                          (uint)local_48[uVar1 + 5 & 7] << 0x10 |
                          (uint)local_48[(ulong)(uVar1 & 7) ^ 4] << 0x18,
             ((0x5a5a5a5a - (next_type & 0xdfdfffdf) |
              (next_type & 0xdfdfffdf) + 0xbebebebf | next_type & 0xc0c0e0c0 ^ 0x40404040) &
             0xe0e0e0e0) != 0)) {
            uVar7 = (ulong)(uVar1 & 7);
            goto LAB_00105387;
          }
          local_40->read_count = local_40->read_count - 8;
          process_chunk(local_40,uVar4,uVar9,next_type);
          iVar10 = 1;
          bVar2 = false;
        }
      }
      else {
LAB_00105387:
        if ((uint)uVar7 < uVar8) {
          uVar9 = (uint)uVar7 + 1;
          uVar7 = (ulong)uVar9;
          uVar9 = (uint)local_48[uVar9 & 7];
        }
        else {
          uVar9 = read_byte(local_40);
          if (uVar9 == 0xffffffff) {
LAB_00105426:
            iVar10 = 7;
            bVar2 = false;
            goto LAB_0010542d;
          }
        }
        pVar11 = pVar11 >> 8 ^ crc_table[pVar11 & 0xff ^ uVar4 >> 0x18];
        uVar4 = uVar4 * 0x100 + uVar9;
        iVar10 = 0;
        bVar2 = true;
      }
LAB_0010542d:
      if (!bVar2) goto LAB_00105534;
      pVar6 = pVar6 + 1;
    } while( true );
  }
LAB_00105571:
  stop(local_40,5,"damaged PNG stream");
LAB_00105534:
  if ((iVar10 != 7) && (iVar10 != 0)) {
    return;
  }
  goto LAB_00105571;
}

Assistant:

static void
read_chunk(struct file *file)
   /* On entry file::data_pos must be set to the position of the first byte
    * of the chunk data *and* the input file must be at this position.  This
    * routine (via process_chunk) instantiates a chunk or IDAT control structure
    * based on file::length and file::type and also resets these fields and
    * file::data_pos for the chunk after this one.  For an IDAT chunk the whole
    * stream of IDATs will be read, until something other than an IDAT is
    * encountered, and the file fields will be set for the chunk after the end
    * of the stream of IDATs.
    *
    * For IEND the file::type field will be set to 0, and nothing beyond the end
    * of the IEND chunk will have been read.
    */
{
   png_uint_32 length = file->length;
   png_uint_32 type = file->type;

   /* After IEND file::type is set to 0, if libpng attempts to read
    * more data at this point this is a bug in libpng.
    */
   if (type == 0)
      stop(file, UNEXPECTED_ERROR_CODE, "read beyond IEND");

   if (file->global->verbose > 2)
   {
      fputs("   ", stderr);
      type_name(type, stderr);
      fprintf(stderr, " %lu\n", (unsigned long)length);
   }

   /* Start the read_crc calculation with the chunk type, then read to the end
    * of the chunk data (without processing it in any way) to check that it is
    * all there and calculate the CRC.
    */
   file->crc = crc_init_4(type);
   if (crc_read_many(file, length)) /* else it was truncated */
   {
      png_uint_32 file_crc; /* CRC read from file */
      unsigned int nread = read_4(file, &file_crc);

      if (nread == 4)
      {
         if (type != png_IEND) /* do not read beyond IEND */
         {
            png_uint_32 next_length;

            nread += read_4(file, &next_length);
            if (nread == 8 && next_length <= 0x7fffffff)
            {
               png_uint_32 next_type;

               nread += read_4(file, &next_type);

               if (nread == 12 && chunk_type_valid(next_type))
               {
                  /* Adjust the read count back to the correct value for this
                   * chunk.
                   */
                  file->read_count -= 8;
                  process_chunk(file, file_crc, next_length, next_type);
                  return;
               }
            }
         }

         else /* IEND */
         {
            process_chunk(file, file_crc, 0, 0);
            return;
         }
      }
   }

   /* Control gets to here if the stream seems invalid or damaged in some
    * way.  Either there was a problem reading all the expected data (this
    * chunk's data, its CRC and the length and type of the next chunk) or the
    * next chunk length/type are invalid.  Notice that the cases that end up
    * here all correspond to cases that would otherwise terminate the read of
    * the PNG file.
    */
   sync_stream(file);
}